

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> * __thiscall
Hpipe::Lexer::flags_abi_cxx11_
          (Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Lexer *this)

{
  Lexem *pLVar1;
  pointer pcVar2;
  istream *piVar3;
  string line;
  string local_1d0 [32];
  istringstream is;
  
  (__return_storage_ptr__->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pLVar1 = &this->first_item;
  do {
    do {
      pLVar1 = pLVar1->next;
      if (pLVar1 == (Lexem *)0x0) {
        return __return_storage_ptr__;
      }
    } while (pLVar1->type != FLAGS);
    pcVar2 = (pLVar1->str)._M_dataplus._M_p;
    line._M_dataplus._M_p = (pointer)&line.field_2;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&line,pcVar2 + 9,pcVar2 + ((pLVar1->str)._M_string_length - 10));
    std::__cxx11::istringstream::istringstream((istringstream *)&is,(string *)&line,_S_in);
    std::__cxx11::string::~string((string *)&line);
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
LAB_00174309:
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&is,(string *)&line);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0) {
      while ((line._M_string_length != 0 &&
             ((*line._M_dataplus._M_p == ' ' || (*line._M_dataplus._M_p == '\t'))))) {
        std::__cxx11::string::substr((ulong)local_1d0,(ulong)&line);
        std::__cxx11::string::operator=((string *)&line,local_1d0);
        std::__cxx11::string::~string(local_1d0);
      }
      while (line._M_string_length != 0) {
        if ((line._M_dataplus._M_p[line._M_string_length - 1] != ' ') &&
           (line._M_dataplus._M_p[line._M_string_length - 1] != '\t')) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&line);
          break;
        }
        std::__cxx11::string::pop_back();
      }
      goto LAB_00174309;
    }
    std::__cxx11::string::~string((string *)&line);
    std::__cxx11::istringstream::~istringstream((istringstream *)&is);
  } while( true );
}

Assistant:

Vec<std::string> Lexer::flags() const {
    Vec<std::string> res;
    for( const Lexem *item = root(); item ; item = item->next ) {
        if ( item->type == Lexem::FLAGS ) {
            std::istringstream is( std::string( item->str.begin() + sizeof( "beg_flags" ) - 1, item->str.end() - sizeof( "end_flags" ) ) );
            std::string line;
            while ( std::getline( is, line ) ) {
                // trim
                while ( line.size() && ( line.front() == ' ' || line.front() == '\t' ) )
                    line = line.substr( 1 );
                while ( line.size() && ( line.back() == ' ' || line.back() == '\t' ) )
                    line.pop_back();
                // register
                if ( line.size() )
                    res << line;
            }
        }
    }
    return res;
}